

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderUtil.hpp
# Opt level: O1

int glu::getDataTypeNumComponents(DataType dataType)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  int *piVar4;
  
  uVar1 = dataType - TYPE_FLOAT;
  if ((uVar1 < 0x22) && ((0x3fc01e00fU >> ((ulong)uVar1 & 0x3f) & 1) != 0)) {
    uVar3 = (ulong)uVar1;
    piVar4 = (int *)&DAT_00bafdb8;
  }
  else {
    if (3 < dataType - TYPE_BOOL) {
      if (8 < dataType - TYPE_FLOAT_MAT2 && 8 < dataType - TYPE_DOUBLE_MAT2) {
        return 0;
      }
      iVar2 = getDataTypeMatrixNumRows(dataType);
      return iVar2;
    }
    uVar3 = (ulong)dataType;
    piVar4 = getDataTypeScalarSize::s_sizes;
  }
  return piVar4[uVar3];
}

Assistant:

inline bool		isDataTypeScalarOrVector	(DataType dataType) { return deInRange32(dataType, TYPE_FLOAT, TYPE_FLOAT_VEC4) || deInRange32(dataType, TYPE_DOUBLE, TYPE_DOUBLE_VEC4) || deInRange32(dataType, TYPE_INT, TYPE_INT_VEC4) || deInRange32(dataType, TYPE_UINT, TYPE_UINT_VEC4) || deInRange32(dataType, TYPE_BOOL, TYPE_BOOL_VEC4); }